

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O2

HTS_Boolean HTS_Engine_generate_state_sequence(HTS_Engine *engine)

{
  HTS_SStreamSet *sss;
  HTS_Boolean HVar1;
  size_t sVar2;
  ulong state_index;
  double dVar3;
  double dVar4;
  
  sss = &engine->sss;
  HVar1 = HTS_SStreamSet_create
                    (sss,&engine->ms,&engine->label,(engine->condition).phoneme_alignment_flag,
                     (engine->condition).speed,(engine->condition).duration_iw,
                     (engine->condition).parameter_iw,(engine->condition).gv_iw);
  if (HVar1 == '\x01') {
    dVar4 = (engine->condition).additional_half_tone;
    HVar1 = '\x01';
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      state_index = 0;
      while( true ) {
        sVar2 = HTS_SStreamSet_get_total_state(sss);
        if (sVar2 <= state_index) break;
        dVar3 = HTS_SStreamSet_get_mean(sss,1,state_index,0);
        dVar3 = (engine->condition).additional_half_tone * 0.05776226504666211 + dVar3;
        dVar4 = 2.995732273553991;
        if ((2.995732273553991 <= dVar3) && (dVar4 = dVar3, 9.903487552536127 < dVar3)) {
          dVar4 = 9.903487552536127;
        }
        HTS_SStreamSet_set_mean(sss,1,state_index,0,dVar4);
        HTS_ModelSet_get_nstate(&engine->ms);
        state_index = state_index + 1;
      }
    }
  }
  else {
    HTS_Engine_refresh(engine);
    HVar1 = '\0';
  }
  return HVar1;
}

Assistant:

static HTS_Boolean HTS_Engine_generate_state_sequence(HTS_Engine * engine)
{
   size_t i, state_index, model_index;
   double f;

   if (HTS_SStreamSet_create(&engine->sss, &engine->ms, &engine->label, engine->condition.phoneme_alignment_flag, engine->condition.speed, engine->condition.duration_iw, engine->condition.parameter_iw, engine->condition.gv_iw) != TRUE) {
      HTS_Engine_refresh(engine);
      return FALSE;
   }
   if (engine->condition.additional_half_tone != 0.0) {
      state_index = 0;
      model_index = 0;
      for (i = 0; i < HTS_Engine_get_total_state(engine); i++) {
         f = HTS_Engine_get_state_mean(engine, 1, i, 0);
         f += engine->condition.additional_half_tone * HALF_TONE;
         if (f < MIN_LF0)
            f = MIN_LF0;
         else if (f > MAX_LF0)
            f = MAX_LF0;
         HTS_Engine_set_state_mean(engine, 1, i, 0, f);
         state_index++;
         if (state_index >= HTS_Engine_get_nstate(engine)) {
            state_index = 0;
            model_index++;
         }
      }
   }
   return TRUE;
}